

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_array.h
# Opt level: O2

ngx_int_t ngx_array_init(ngx_array_t *array,ngx_pool_t *pool,ngx_uint_t n,size_t size)

{
  void *pvVar1;
  
  array->nelts = 0;
  array->size = 0x38;
  array->nalloc = n;
  array->pool = pool;
  pvVar1 = ngx_palloc(pool,n * 0x38);
  array->elts = pvVar1;
  return -(ulong)(pvVar1 == (void *)0x0);
}

Assistant:

static ngx_inline ngx_int_t
ngx_array_init(ngx_array_t *array, ngx_pool_t *pool, ngx_uint_t n, size_t size)
{
    /*
     * set "array->nelts" before "array->elts", otherwise MSVC thinks
     * that "array->nelts" may be used without having been initialized
     */

    array->nelts = 0;
    array->size = size;
    array->nalloc = n;
    array->pool = pool;

    array->elts = ngx_palloc(pool, n * size);
    if (array->elts == NULL) {
        return NGX_ERROR;
    }

    return NGX_OK;
}